

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *
METADemuxer::mergePlayItems
          (vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *__return_storage_ptr__,
          vector<MPLSParser,_std::allocator<MPLSParser>_> *mplsInfoList)

{
  bool bVar1;
  reference pMVar2;
  reference __x;
  MPLSPlayItem *j;
  const_iterator __end2;
  const_iterator __begin2;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *__range2;
  MPLSParser *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MPLSParser,_std::allocator<MPLSParser>_> *__range1;
  vector<MPLSParser,_std::allocator<MPLSParser>_> *mplsInfoList_local;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *result;
  
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<MPLSParser,_std::allocator<MPLSParser>_>::begin(mplsInfoList);
  i = (MPLSParser *)std::vector<MPLSParser,_std::allocator<MPLSParser>_>::end(mplsInfoList);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_MPLSParser_*,_std::vector<MPLSParser,_std::allocator<MPLSParser>_>_>
                                     *)&i), bVar1) {
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_MPLSParser_*,_std::vector<MPLSParser,_std::allocator<MPLSParser>_>_>
             ::operator*(&__end1);
    __end2 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::begin(&pMVar2->m_playItems);
    j = (MPLSPlayItem *)
        std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::end(&pMVar2->m_playItems);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_MPLSPlayItem_*,_std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>_>
                                       *)&j), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<const_MPLSPlayItem_*,_std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>_>
            ::operator*(&__end2);
      std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::push_back
                (__return_storage_ptr__,__x);
      __gnu_cxx::
      __normal_iterator<const_MPLSPlayItem_*,_std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_MPLSParser_*,_std::vector<MPLSParser,_std::allocator<MPLSParser>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MPLSPlayItem> METADemuxer::mergePlayItems(const std::vector<MPLSParser>& mplsInfoList)
{
    std::vector<MPLSPlayItem> result;
    for (auto& i : mplsInfoList)
    {
        for (auto& j : i.m_playItems) result.push_back(j);
    }
    return result;
}